

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

void Cec_ManRefinedClassPrintStats(Gia_Man_t *p,Vec_Str_t *vStatus,int iIter,abctime Time)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  iVar2 = p->nObjs;
  uVar8 = 0;
  uVar13 = 0;
  iVar5 = 0;
  if (1 < (long)iVar2) {
    iVar5 = 0;
    lVar9 = 1;
    uVar13 = 0;
    uVar8 = 0;
    do {
      uVar10 = (uint)p->pReprs[lVar9] & 0xfffffff;
      if ((uVar10 == 0xfffffff) && (p->pNexts[lVar9] == 0)) {
        iVar5 = iVar5 + 1;
      }
      else if (uVar10 == 0) {
        uVar8 = uVar8 + 1;
      }
      else {
        uVar12 = 0;
        if (uVar10 == 0xfffffff) {
          uVar12 = (uint)(0 < p->pNexts[lVar9]);
        }
        uVar13 = uVar13 + uVar12;
      }
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
  }
  iVar3 = p->vCos->nSize;
  iVar4 = p->vCis->nSize;
  uVar10 = ~(iVar4 + iVar3);
  uVar12 = (iVar2 - (iVar5 + uVar13)) + iVar3 + iVar4 + uVar10;
  if (iIter == -1) {
    Abc_Print(uVar10,"BMC : ");
  }
  else {
    Abc_Print(uVar10,"%3d : ");
  }
  uVar7 = 0;
  Abc_Print(uVar10,"c =%8d  cl =%7d  lit =%8d  ",(ulong)uVar8,(ulong)uVar13,(ulong)uVar12);
  if (vStatus == (Vec_Str_t *)0x0) {
    uVar6 = 0;
    uVar11 = 0;
  }
  else {
    uVar6 = 0;
    uVar11 = 0;
    uVar7 = 0;
    if (0 < (long)vStatus->nSize) {
      lVar9 = 0;
      uVar11 = 0;
      uVar6 = 0;
      uVar7 = 0;
      do {
        bVar1 = vStatus->pArray[lVar9];
        uVar10 = (uint)bVar1;
        if (bVar1 == 0) {
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        else if (bVar1 == 0xff) {
          uVar11 = (ulong)((int)uVar11 + 1);
        }
        else if (bVar1 == 1) {
          uVar7 = uVar7 + 1;
        }
        lVar9 = lVar9 + 1;
      } while (vStatus->nSize != lVar9);
    }
  }
  Abc_Print(uVar10,"p =%6d  d =%6d  f =%6d  ",(ulong)uVar7,uVar6,uVar11);
  iVar2 = p->vCos->nSize;
  if (iVar2 <= p->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar2 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = *p->vCos->pArray;
  if ((-1 < (long)iVar2) && (iVar2 < p->nObjs)) {
    Abc_Print(uVar10,"%c  ",
              (ulong)((uint)(((uint)p->pReprs[(int)(iVar2 - (*(uint *)(p->pObjs + iVar2) &
                                                            0x1fffffff))] & 0xfffffff) != 0) * 2 +
                     0x2b));
    Abc_Print(uVar10,"%s =","T");
    Abc_Print(uVar10,"%9.2f sec\n",(double)Time / 1000000.0);
    return;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Cec_ManRefinedClassPrintStats( Gia_Man_t * p, Vec_Str_t * vStatus, int iIter, abctime Time )
{ 
    int nLits, CounterX = 0, Counter0 = 0, Counter = 0;
    int i, Entry, nProve = 0, nDispr = 0, nFail = 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
    {
        if ( Gia_ObjIsNone(p, i) )
            CounterX++;
        else if ( Gia_ObjIsConst(p, i) )
            Counter0++;
        else if ( Gia_ObjIsHead(p, i) )
            Counter++;
    }
    CounterX -= Gia_ManCoNum(p);
    nLits = Gia_ManCiNum(p) + Gia_ManAndNum(p) - Counter - CounterX;
    if ( iIter == -1 )
        Abc_Print( 1, "BMC : " );
    else
        Abc_Print( 1, "%3d : ", iIter );
    Abc_Print( 1, "c =%8d  cl =%7d  lit =%8d  ", Counter0, Counter, nLits );
    if ( vStatus )
    Vec_StrForEachEntry( vStatus, Entry, i )
    {
        if ( Entry == 1 )
            nProve++;
        else if ( Entry == 0 )
            nDispr++;
        else if ( Entry == -1 )
            nFail++;
    }
    Abc_Print( 1, "p =%6d  d =%6d  f =%6d  ", nProve, nDispr, nFail );
    Abc_Print( 1, "%c  ", Gia_ObjIsConst( p, Gia_ObjFaninId0p(p, Gia_ManPo(p, 0)) ) ? '+' : '-' );
    Abc_PrintTime( 1, "T", Time );
}